

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  size_t sVar1;
  double *pdVar2;
  ostream *poVar3;
  double dVar4;
  rep_conflict rVar5;
  InterVal all;
  duration<double,_std::ratio<1L,_1L>_> diff;
  time_point end;
  time_point start;
  int i;
  double w_z;
  double w_y;
  double w_x;
  double a_z;
  double a_y;
  double a_x;
  OscilatorNorm norm;
  OscilatorSignal signal;
  
  oscilator::OscilatorSignal::OscilatorSignal((OscilatorSignal *)&norm.m_Zero);
  oscilator::OscilatorNorm::OscilatorNorm((OscilatorNorm *)&a_x);
  start.__d.__r._4_4_ = 0;
  while( true ) {
    sVar1 = oscilator::OscilatorSignal::size((OscilatorSignal *)&norm.m_Zero);
    if (sVar1 <= (ulong)(long)start.__d.__r._4_4_) break;
    dVar4 = sin((double)start.__d.__r._4_4_ * 10.0 * 0.001);
    pdVar2 = oscilator::OscilatorSignal::getX
                       ((OscilatorSignal *)&norm.m_Zero,(long)start.__d.__r._4_4_);
    *pdVar2 = dVar4 * 10.0;
    dVar4 = sin((double)start.__d.__r._4_4_ * 20.0 * 0.001);
    pdVar2 = oscilator::OscilatorSignal::getY
                       ((OscilatorSignal *)&norm.m_Zero,(long)start.__d.__r._4_4_);
    *pdVar2 = dVar4 * 20.0;
    dVar4 = sin((double)start.__d.__r._4_4_ * 40.0 * 0.001);
    pdVar2 = oscilator::OscilatorSignal::getZ
                       ((OscilatorSignal *)&norm.m_Zero,(long)start.__d.__r._4_4_);
    *pdVar2 = dVar4 * 40.0;
    start.__d.__r._4_4_ = start.__d.__r._4_4_ + 1;
  }
  end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  oscilator::OscilatorTools::calcNorm((OscilatorSignal *)&norm.m_Zero,(OscilatorNorm *)&a_x);
  diff.__r = (rep_conflict)std::chrono::_V2::system_clock::now();
  all.m_Last = (size_t)std::chrono::operator-
                                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)&diff,&end);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&stack0xffffffffffe151b0,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&all.m_Last);
  poVar3 = std::operator<<((ostream *)&std::cout,"Threaded exec time: ");
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffe151b0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar1 = oscilator::OscilatorNorm::size((OscilatorNorm *)&a_x);
  oscilator::InterVal::InterVal((InterVal *)&stack0xffffffffffe15198,0,sVar1);
  end.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  oscilator::OscilatorTools::calcNormOnInterval
            ((OscilatorSignal *)&norm.m_Zero,(OscilatorNorm *)&a_x,
             (InterVal *)&stack0xffffffffffe15198);
  diff.__r = (rep_conflict)std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&diff,&end);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&stack0xffffffffffe15180,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xffffffffffe15178);
  poVar3 = std::operator<<((ostream *)&std::cout,"One thread exec time: ");
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffe151b0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    oscilator::OscilatorSignal signal;
    oscilator::OscilatorNorm norm;
    double a_x(10);
    double a_y(20);
    double a_z(40);

    double w_x(10);
    double w_y(20);
    double w_z(40);

    for(int i = 0; i < signal.size(); i++)
    {
        signal.getX(i) = a_x*sin(w_x * i * oscilator::SAMPLE_TIME);
        signal.getY(i) = a_y*sin(w_y * i * oscilator::SAMPLE_TIME);
        signal.getZ(i) = a_z*sin(w_z * i * oscilator::SAMPLE_TIME);
    }


    auto start = std::chrono::system_clock::now();

    oscilator::OscilatorTools::calcNorm(signal, norm);
    auto end = std::chrono::system_clock::now();
    std::chrono::duration<double> diff = end-start;
    std::cout << "Threaded exec time: " << diff.count() << std::endl;

    oscilator::InterVal all(0, norm.size());

    start = std::chrono::system_clock::now();
    // do some work
    oscilator::OscilatorTools::calcNormOnInterval(signal, norm, all);
    end = std::chrono::system_clock::now();
    diff = end-start;
    std::cout << "One thread exec time: " << diff.count() << std::endl;

    return 0;
}